

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

int chirc_ctx_load_network(chirc_ctx_t *ctx,char *file,char *servername)

{
  int iVar1;
  sds *s;
  size_t len_00;
  chirc_server_t *pcVar2;
  chirc_server_t *ns;
  sds *ppcStack_58;
  int count;
  sds *tokens;
  sds line;
  ssize_t read;
  size_t len;
  char *l;
  FILE *fp;
  char *servername_local;
  char *file_local;
  chirc_ctx_t *ctx_local;
  
  len = 0;
  read = 0;
  fp = (FILE *)servername;
  servername_local = file;
  file_local = (char *)ctx;
  l = (char *)fopen(file,"r");
  if ((FILE *)l == (FILE *)0x0) {
    serverlog(CRITICAL,(chirc_connection_t *)0x0,"Could not read file %s\n",servername_local);
    ctx_local._4_4_ = -1;
  }
  else {
    while (line = (sds)getline((char **)&len,(size_t *)&read,(FILE *)l),
          line != (sds)0xffffffffffffffff) {
      tokens = (sds *)sdsnew((char *)len);
      s = (sds *)sdstrim((sds)tokens," \r\n");
      tokens = s;
      len_00 = sdslen((sds)s);
      ppcStack_58 = sdssplitlen((char *)s,len_00,",",1,(int *)((long)&ns + 4));
      if (ns._4_4_ != 4) {
        serverlog(CRITICAL,(chirc_connection_t *)0x0,"Invalid line in network file: %s",tokens);
        return -1;
      }
      pcVar2 = chirc_ctx_get_server((chirc_ctx_t *)file_local,*ppcStack_58);
      if (pcVar2 != (chirc_server_t *)0x0) {
        serverlog(CRITICAL,(chirc_connection_t *)0x0,
                  "Network file contains duplicate server name: %s",pcVar2->servername);
        return -1;
      }
      pcVar2 = (chirc_server_t *)calloc(1,0x68);
      pcVar2->servername = *ppcStack_58;
      pcVar2->hostname = ppcStack_58[1];
      pcVar2->port = ppcStack_58[2];
      pcVar2->passwd = ppcStack_58[3];
      pcVar2->conn = (chirc_connection_t *)0x0;
      chirc_ctx_add_server((chirc_ctx_t *)file_local,pcVar2);
      iVar1 = strcmp(pcVar2->servername,(char *)fp);
      if (iVar1 == 0) {
        *(chirc_server_t **)(file_local + 0x18) = pcVar2;
      }
    }
    fclose((FILE *)l);
    free((void *)len);
    if (*(long *)(file_local + 0x18) == 0) {
      serverlog(CRITICAL,(chirc_connection_t *)0x0,"Network file does not include an entry for %s",
                fp);
      ctx_local._4_4_ = -1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int chirc_ctx_load_network(chirc_ctx_t *ctx, char *file, char *servername)
{
    FILE *fp;
    char *l = NULL;
    size_t len = 0;
    ssize_t read;

    fp = fopen(file, "r");
    if (fp == NULL)
    {
        serverlog(CRITICAL, NULL, "Could not read file %s\n", file);
        return CHIRC_FAIL;
    }

    while ((read = getline(&l, &len, fp)) != -1)
    {
        sds line = sdsnew(l);
        line = sdstrim(line, " \r\n");
        sds *tokens;
        int count;

        tokens = sdssplitlen(line, sdslen(line),",",1, &count);

        if (count != 4)
        {
            serverlog(CRITICAL, NULL, "Invalid line in network file: %s", line);
            return CHIRC_FAIL;
        }

        chirc_server_t *ns;

        ns = chirc_ctx_get_server(ctx, tokens[0]);

        if (ns)
        {
            serverlog(CRITICAL, NULL, "Network file contains duplicate server name: %s", ns->servername);
            return CHIRC_FAIL;
        }

        ns = calloc(1, sizeof(chirc_server_t));

        ns->servername = tokens[0];
        ns->hostname = tokens[1];
        ns->port = tokens[2];
        ns->passwd = tokens[3];
        ns->conn = NULL;

        chirc_ctx_add_server(ctx, ns);

        if (strcmp(ns->servername, servername) == 0)
        {
            ctx->network.this_server = ns;
        }
    }

    fclose(fp);
    free(l);

    if (ctx->network.this_server == NULL)
    {
        serverlog(CRITICAL, NULL, "Network file does not include an entry for %s", servername);
        return CHIRC_FAIL;
    }

    return CHIRC_OK;
}